

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall kpeg::JPEGEncoder::computeDCT(JPEGEncoder *this)

{
  Level LVar1;
  uint uVar2;
  uint uVar3;
  Logger *pLVar4;
  element_type *peVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  char *pcVar10;
  void *pvVar11;
  long in_RDI;
  float fVar12;
  double dVar13;
  double dVar14;
  int x_1;
  int y_1;
  int c;
  int x;
  int y;
  float coeff [3];
  float Cv;
  float Cu;
  int u;
  int v;
  array<std::array<kpeg::FPixel,_8UL>,_8UL> coefficients;
  int ix;
  int iy;
  Image *in_stack_fffffffffffffb38;
  __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffb40;
  array<std::array<kpeg::FPixel,_8UL>,_8UL> *in_stack_fffffffffffffb50;
  char *local_498;
  char *local_400;
  string local_3d0 [44];
  Level in_stack_fffffffffffffc5c;
  int local_380;
  int local_37c;
  int local_364;
  int local_360;
  int local_35c;
  float local_358 [4];
  float local_348;
  int local_344;
  int local_340;
  int local_3c;
  int local_38;
  string local_28 [40];
  
  pLVar4 = Logger::get();
  LVar1 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar1) {
    pLVar4 = Logger::get();
    poVar9 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(in_stack_fffffffffffffc5c);
    poVar9 = std::operator<<(poVar9,local_28);
    poVar9 = std::operator<<(poVar9,"[ kpeg:");
    pcVar10 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                      ,0x2f);
    if (pcVar10 == (char *)0x0) {
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
      ;
    }
    else {
      local_400 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                          ,0x2f);
      local_400 = local_400 + 1;
    }
    poVar9 = std::operator<<(poVar9,local_400);
    poVar9 = std::operator<<(poVar9,":");
    pvVar11 = (void *)std::ostream::operator<<(poVar9,std::dec);
    poVar9 = (ostream *)std::ostream::operator<<(pvVar11,0x1b4);
    poVar9 = std::operator<<(poVar9," ] ");
    poVar9 = std::operator<<(poVar9,"Applying Forward DCT on components...");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  for (local_38 = 0; uVar2 = local_38 + 7, uVar3 = Image::getHeight((Image *)(in_RDI + 0x428)),
      uVar2 < uVar3; local_38 = local_38 + 8) {
    for (local_3c = 0; uVar2 = local_3c + 7, uVar3 = Image::getWidth((Image *)(in_RDI + 0x428)),
        uVar2 < uVar3; local_3c = local_3c + 8) {
      std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::array(in_stack_fffffffffffffb50);
      for (local_340 = 0; local_340 < 8; local_340 = local_340 + 1) {
        for (local_344 = 0; local_344 < 8; local_344 = local_344 + 1) {
          if (local_344 == 0) {
            dVar13 = std::sqrt(5.30498947741318e-315);
            local_348 = 1.0 / SUB84(dVar13,0);
          }
          else {
            local_348 = 1.0;
          }
          if (local_340 == 0) {
            dVar13 = std::sqrt(5.30498947741318e-315);
            local_358[3] = 1.0 / SUB84(dVar13,0);
          }
          else {
            local_358[3] = 1.0;
          }
          memset(local_358,0,0xc);
          for (local_35c = local_38; local_35c < local_38 + 8; local_35c = local_35c + 1) {
            for (local_360 = local_3c; local_360 < local_3c + 8; local_360 = local_360 + 1) {
              for (local_364 = 0; local_364 < 3; local_364 = local_364 + 1) {
                Image::getFlPixelPtr(in_stack_fffffffffffffb38);
                peVar5 = std::
                         __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*(in_stack_fffffffffffffb40);
                pvVar6 = std::
                         vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
                         ::operator[](peVar5,(long)local_35c);
                pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                                   (pvVar6,(long)local_360);
                fVar12 = pvVar7->comp[local_364];
                dVar13 = cos(((double)((local_360 * 2 + 1) * local_344) * 3.141592653589793) / 16.0)
                ;
                dVar14 = cos(((double)((local_35c * 2 + 1) * local_340) * 3.141592653589793) / 16.0)
                ;
                local_358[local_364] =
                     (float)((double)fVar12 * dVar13 * dVar14 + (double)local_358[local_364]);
                std::
                shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                               *)0x14c2b2);
              }
            }
          }
          local_358[0] = local_348 * 0.25 * local_358[3] * local_358[0];
          local_358[1] = local_348 * 0.25 * local_358[3] * local_358[1];
          local_358[2] = local_348 * 0.25 * local_358[3] * local_358[2];
          fVar12 = roundf(local_358[0] * 100.0);
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          pvVar8->comp[0] = fVar12 / 100.0;
          fVar12 = roundf(local_358[1] * 100.0);
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          pvVar8->comp[1] = fVar12 / 100.0;
          fVar12 = roundf(local_358[2] * 100.0);
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          pvVar8->comp[2] = fVar12 / 100.0;
        }
      }
      for (local_37c = local_38; local_37c < local_38 + 8; local_37c = local_37c + 1) {
        for (local_380 = local_3c; local_380 < local_3c + 8; local_380 = local_380 + 1) {
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          fVar12 = pvVar8->comp[0];
          Image::getFlPixelPtr(in_stack_fffffffffffffb38);
          peVar5 = std::
                   __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(in_stack_fffffffffffffb40);
          pvVar6 = std::
                   vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
                   ::operator[](peVar5,(long)local_37c);
          pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                             (pvVar6,(long)local_380);
          pvVar7->comp[0] = fVar12;
          std::
          shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
          ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                         *)0x14c5a0);
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          fVar12 = pvVar8->comp[1];
          Image::getFlPixelPtr(in_stack_fffffffffffffb38);
          peVar5 = std::
                   __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(in_stack_fffffffffffffb40);
          pvVar6 = std::
                   vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
                   ::operator[](peVar5,(long)local_37c);
          pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                             (pvVar6,(long)local_380);
          pvVar7->comp[1] = fVar12;
          std::
          shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
          ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                         *)0x14c643);
          std::array<std::array<kpeg::FPixel,_8UL>,_8UL>::operator[]
                    ((array<std::array<kpeg::FPixel,_8UL>,_8UL> *)in_stack_fffffffffffffb40,
                     (size_type)in_stack_fffffffffffffb38);
          pvVar8 = std::array<kpeg::FPixel,_8UL>::operator[]
                             ((array<kpeg::FPixel,_8UL> *)in_stack_fffffffffffffb40,
                              (size_type)in_stack_fffffffffffffb38);
          fVar12 = pvVar8->comp[2];
          Image::getFlPixelPtr(in_stack_fffffffffffffb38);
          peVar5 = std::
                   __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(in_stack_fffffffffffffb40);
          pvVar6 = std::
                   vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
                   ::operator[](peVar5,(long)local_37c);
          pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                             (pvVar6,(long)local_380);
          pvVar7->comp[2] = fVar12;
          std::
          shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
          ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                         *)0x14c6e6);
        }
      }
    }
  }
  pLVar4 = Logger::get();
  LVar1 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar1) {
    pLVar4 = Logger::get();
    poVar9 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(in_stack_fffffffffffffc5c);
    poVar9 = std::operator<<(poVar9,local_3d0);
    poVar9 = std::operator<<(poVar9,"[ kpeg:");
    pcVar10 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                      ,0x2f);
    if (pcVar10 == (char *)0x0) {
      local_498 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
      ;
    }
    else {
      local_498 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                          ,0x2f);
      local_498 = local_498 + 1;
    }
    poVar9 = std::operator<<(poVar9,local_498);
    poVar9 = std::operator<<(poVar9,":");
    pvVar11 = (void *)std::ostream::operator<<(poVar9,std::dec);
    poVar9 = (ostream *)std::ostream::operator<<(pvVar11,0x1f2);
    poVar9 = std::operator<<(poVar9," ] ");
    poVar9 = std::operator<<(poVar9,"Forward DCT applied [OK]");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3d0);
  }
  return;
}

Assistant:

void kpeg::JPEGEncoder::computeDCT()
    {
        LOG(Logger::Level::INFO) << "Applying Forward DCT on components..." << std::endl;
        
        // Traverse the pixel pointer, 8x8 blocks at a time
        for ( int iy = 0; iy + 8 - 1 < m_image.getHeight(); iy += 8 )
        {
            for ( int ix = 0; ix + 8 - 1 < m_image.getWidth(); ix += 8 )
            {
                std::array<std::array<FPixel, 8>, 8> coefficients;
                
                for ( int v = 0; v < 8; ++v )
                {
                    for ( int u = 0; u < 8; ++u )
                    {
                        float Cu = u == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float Cv = v == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float coeff[3] = { 0.f, 0.f, 0.f };
                        
                        for ( int y = iy; y < iy + 8; ++y )
                        {
                            for ( int x = ix; x < ix + 8; ++x )
                            {
                                for ( int c = 0; c < 3; ++c )
                                {
                                    coeff[c] += (*m_image.getFlPixelPtr())[y][x].comp[c] *
                                                 std::cos( ( 2 * x + 1 ) * u * M_PI / 16 ) *
                                                  std::cos( ( 2 * y + 1 ) * v * M_PI / 16 );
                                }
                            }
                        }
                        
                        coeff[YCbCrComponents::Y] = 0.25f * Cu * Cv * coeff[0];
                        coeff[YCbCrComponents::Cb] = 0.25f * Cu * Cv * coeff[1];
                        coeff[YCbCrComponents::Cr] = 0.25f * Cu * Cv * coeff[2];
                        
                        coefficients[v][u].comp[YCbCrComponents::Y] = std::roundf( coeff[YCbCrComponents::Y] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cb] = std::roundf( coeff[YCbCrComponents::Cb] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cr] = std::roundf( coeff[YCbCrComponents::Cr] * 100 ) / 100;
                    }
                }
                
                for ( int y = iy; y < iy + 8; ++y )
                {
                    for ( int x = ix; x < ix + 8; ++x )
                    {
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Y];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cb];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cr];
                    }
                }
            }
        }
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
        
        LOG(Logger::Level::INFO) << "Forward DCT applied [OK]" << std::endl;
    }